

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_nds_with_explicit_dates_Test::
SubjectFactoryTest_test_setting_nds_with_explicit_dates_Test
          (SubjectFactoryTest_test_setting_nds_with_explicit_dates_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0026d6d8;
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_nds_with_explicit_dates)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarFixingDate=20190308,FarQuantity=850000.00,FarSettlementDate=20190310,FarTenor=BD,FixingDate=20180915,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20180918,Symbol=USDCNY,Tenor=BD,User=fbennett",
            subject_factory.Fx().Stream().Nds()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("USDCNY")
                    .Currency("USD")
                    .NearQuantity(1000000)
                    .NearTenor(Tenor::BROKEN_DATE)
                    .NearFixingDate(new Date(2018, 9, 15))
                    .NearSettlementDate(new Date(2018, 9, 18))
                    .FarQuantity(850000)
                    .FarTenor(Tenor::BROKEN_DATE)
                    .FarFixingDate(new Date(2019, 3, 8))
                    .FarSettlementDate(new Date(2019, 3, 10))
                    .CreateSubject()
                    .ToString().c_str());
}